

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap.hpp
# Opt level: O0

Boxed_Value __thiscall
chaiscript::bootstrap::ptr_assign<chaiscript::dispatch::Proxy_Function_Base>
          (bootstrap *this,Boxed_Value *lhs,
          shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *rhs)

{
  bool bVar1;
  Type_Info *pTVar2;
  bad_boxed_cast *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Value BVar3;
  bool local_89;
  bool local_69;
  Static_String local_68;
  Boxed_Value local_58;
  Boxed_Value local_48;
  Type_Info local_38;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *local_20;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *rhs_local;
  Boxed_Value *lhs_local;
  
  local_20 = rhs;
  rhs_local = (shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)lhs;
  lhs_local = (Boxed_Value *)this;
  bVar1 = Boxed_Value::is_undef(lhs);
  local_69 = true;
  if (!bVar1) {
    pTVar2 = Boxed_Value::get_type_info(lhs);
    bVar1 = Type_Info::is_const(pTVar2);
    local_89 = false;
    if (!bVar1) {
      pTVar2 = Boxed_Value::get_type_info(lhs);
      detail::Get_Type_Info<chaiscript::dispatch::Proxy_Function_Base>::get();
      local_89 = Type_Info::bare_equal(pTVar2,&local_38);
    }
    local_69 = local_89;
  }
  if (local_69 == false) {
    this_00 = (bad_boxed_cast *)__cxa_allocate_exception(0x38);
    utility::Static_String::Static_String<36ul>
              (&local_68,(char (*) [36])"type mismatch in pointer assignment");
    exception::bad_boxed_cast::bad_boxed_cast(this_00,local_68);
    __cxa_throw(this_00,&exception::bad_boxed_cast::typeinfo,
                exception::bad_boxed_cast::~bad_boxed_cast);
  }
  Boxed_Value::Boxed_Value<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>const&,void>
            (&local_58,local_20,false);
  Boxed_Value::assign(&local_48,lhs);
  Boxed_Value::~Boxed_Value(&local_48);
  Boxed_Value::~Boxed_Value(&local_58);
  Boxed_Value::Boxed_Value((Boxed_Value *)this,lhs);
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value ptr_assign(Boxed_Value lhs, const std::shared_ptr<Type> &rhs) {
    if (lhs.is_undef() || (!lhs.get_type_info().is_const() && lhs.get_type_info().bare_equal(chaiscript::detail::Get_Type_Info<Type>::get()))) {
      lhs.assign(Boxed_Value(rhs));
      return lhs;
    } else {
      throw exception::bad_boxed_cast("type mismatch in pointer assignment");
    }
  }